

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubModel.cpp
# Opt level: O3

void __thiscall
iDynTree::SubModelDecomposition::setNrOfSubModels(SubModelDecomposition *this,size_t nrOfSubModels)

{
  pointer ppTVar1;
  Traversal *pTVar2;
  ulong uVar3;
  
  ppTVar1 = (this->subModelTraversals).
            super__Vector_base<iDynTree::Traversal_*,_std::allocator<iDynTree::Traversal_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->subModelTraversals).
      super__Vector_base<iDynTree::Traversal_*,_std::allocator<iDynTree::Traversal_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppTVar1) {
    uVar3 = 0;
    do {
      pTVar2 = ppTVar1[uVar3];
      if (pTVar2 != (Traversal *)0x0) {
        Traversal::~Traversal(pTVar2);
      }
      operator_delete(pTVar2,0x60);
      (this->subModelTraversals).
      super__Vector_base<iDynTree::Traversal_*,_std::allocator<iDynTree::Traversal_*>_>._M_impl.
      super__Vector_impl_data._M_start[uVar3] = (Traversal *)0x0;
      uVar3 = uVar3 + 1;
      ppTVar1 = (this->subModelTraversals).
                super__Vector_base<iDynTree::Traversal_*,_std::allocator<iDynTree::Traversal_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar3 < (ulong)((long)(this->subModelTraversals).
                                   super__Vector_base<iDynTree::Traversal_*,_std::allocator<iDynTree::Traversal_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar1 >> 3))
    ;
  }
  std::vector<iDynTree::Traversal_*,_std::allocator<iDynTree::Traversal_*>_>::resize
            (&this->subModelTraversals,nrOfSubModels);
  if ((this->subModelTraversals).
      super__Vector_base<iDynTree::Traversal_*,_std::allocator<iDynTree::Traversal_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->subModelTraversals).
      super__Vector_base<iDynTree::Traversal_*,_std::allocator<iDynTree::Traversal_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar3 = 0;
    do {
      pTVar2 = (Traversal *)operator_new(0x60);
      Traversal::Traversal(pTVar2);
      (this->subModelTraversals).
      super__Vector_base<iDynTree::Traversal_*,_std::allocator<iDynTree::Traversal_*>_>._M_impl.
      super__Vector_impl_data._M_start[uVar3] = pTVar2;
      uVar3 = uVar3 + 1;
    } while (uVar3 < (ulong)((long)(this->subModelTraversals).
                                   super__Vector_base<iDynTree::Traversal_*,_std::allocator<iDynTree::Traversal_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->subModelTraversals).
                                   super__Vector_base<iDynTree::Traversal_*,_std::allocator<iDynTree::Traversal_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  return;
}

Assistant:

void SubModelDecomposition::setNrOfSubModels(const size_t nrOfSubModels)
{
    for(size_t smIdx=0; smIdx < subModelTraversals.size(); smIdx++ )
    {
        delete subModelTraversals[smIdx];
        subModelTraversals[smIdx] = 0;
    }

    subModelTraversals.resize(nrOfSubModels);

    for(size_t smIdx=0; smIdx < subModelTraversals.size(); smIdx++ )
    {
        subModelTraversals[smIdx] = new Traversal();
    }
}